

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[14],unsigned_int,char[40],unsigned_char,char[39],unsigned_int,char[2]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [14],uint *RestArgs,char (*RestArgs_1) [40],uchar *RestArgs_2,
               char (*RestArgs_3) [39],uint *RestArgs_4,char (*RestArgs_5) [2])

{
  char (*RestArgs_local_3) [39];
  uchar *RestArgs_local_2;
  char (*RestArgs_local_1) [40];
  uint *RestArgs_local;
  char (*FirstArg_local) [14];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[14]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,unsigned_int,char[40],unsigned_char,char[39],unsigned_int,char[2]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}